

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

bool __thiscall psy::C::Parser::ignoreDeclarator(Parser *this)

{
  SyntaxKind SVar1;
  SyntaxToken *pSVar2;
  
  while( true ) {
    pSVar2 = peek(this,1);
    SVar1 = pSVar2->syntaxK_;
    if (SVar1 == EndOfFile) {
      return false;
    }
    if (SVar1 == IdentifierToken) {
      return false;
    }
    if (SVar1 == CloseBraceToken) break;
    if (SVar1 == CommaToken) {
      return false;
    }
    if (SVar1 == AsteriskToken) {
      return false;
    }
    if (SVar1 == SemicolonToken) break;
    this->curTkIdx_ = this->curTkIdx_ + 1;
  }
  this->curTkIdx_ = this->curTkIdx_ + 1;
  return false;
}

Assistant:

bool Parser::ignoreDeclarator()
{
    while (true) {
        switch (peek().kind()) {
            // Just return.
            case SyntaxKind::EndOfFile:
            case SyntaxKind::CommaToken:
            case SyntaxKind::IdentifierToken:
            case SyntaxKind::AsteriskToken:
                return false;

            // Skip and return.
            case SyntaxKind::SemicolonToken:
            case SyntaxKind::CloseBraceToken:
                consume();
                return false;

            // Skip.
            default:
                consume();
        }
    }
}